

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirstWorkingReporter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::FirstWorkingReporter::FirstWorkingReporter
          (FirstWorkingReporter *this,
          vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
          *theReporters)

{
  bool bVar1;
  undefined8 in_RSI;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  *in_RDI;
  Reporter *r;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *__range1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff98;
  __normal_iterator<ApprovalTests::Reporter_*const_*,_std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>_>
  local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  Reporter::Reporter((Reporter *)in_RDI);
  (in_RDI->
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__FirstWorkingReporter_002a2f38;
  ::std::
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ::vector((vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
            *)0x12cbde);
  local_18 = local_10;
  local_20._M_current =
       (Reporter **)
       ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::begin
                 ((vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
                  in_stack_ffffffffffffff98);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::end
            ((vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ApprovalTests::Reporter_*const_*,_std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<ApprovalTests::Reporter_*const_*,_std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<ApprovalTests::Reporter_*const_*,_std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>_>
    ::operator*(&local_20);
    in_stack_ffffffffffffff98 =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         &(in_RDI->
          super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
          )._M_impl.super__Vector_impl_data._M_finish;
    ::std::shared_ptr<ApprovalTests::Reporter>::shared_ptr<ApprovalTests::Reporter,void>
              ((shared_ptr<ApprovalTests::Reporter> *)in_RDI,(Reporter *)in_stack_ffffffffffffff98);
    ::std::
    vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
    ::push_back(in_RDI,(value_type *)in_stack_ffffffffffffff98);
    ::std::shared_ptr<ApprovalTests::Reporter>::~shared_ptr
              ((shared_ptr<ApprovalTests::Reporter> *)0x12cc6b);
    __gnu_cxx::
    __normal_iterator<ApprovalTests::Reporter_*const_*,_std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

FirstWorkingReporter::FirstWorkingReporter(const std::vector<Reporter*>& theReporters)
    {
        for (auto r : theReporters)
        {
            reporters.push_back(std::shared_ptr<Reporter>(r));
        }
    }